

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

double __thiscall double_conversion::Double::NextDouble(Double *this)

{
  int iVar1;
  uint64_t uVar2;
  Double *in_RDI;
  Double in_stack_ffffffffffffffd8;
  Double local_20;
  Double local_18 [2];
  double local_8;
  
  if (in_RDI->d64_ == 0x7ff0000000000000) {
    Double(local_18,0x7ff0000000000000);
    local_8 = value((Double *)0x85dd50);
  }
  else {
    iVar1 = Sign(in_RDI);
    if ((iVar1 < 0) && (uVar2 = Significand(in_stack_ffffffffffffffd8.d64_), uVar2 == 0)) {
      return 0.0;
    }
    iVar1 = Sign(in_RDI);
    if (iVar1 < 0) {
      Double(&local_20,in_RDI->d64_ - 1);
      local_8 = value((Double *)0x85ddb4);
    }
    else {
      Double((Double *)&stack0xffffffffffffffd8,in_RDI->d64_ + 1);
      local_8 = value((Double *)0x85dddc);
    }
  }
  return local_8;
}

Assistant:

double NextDouble() const {
    if (d64_ == kInfinity) return Double(kInfinity).value();
    if (Sign() < 0 && Significand() == 0) {
      // -0.0
      return 0.0;
    }
    if (Sign() < 0) {
      return Double(d64_ - 1).value();
    } else {
      return Double(d64_ + 1).value();
    }
  }